

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O2

void preconditioner_to_regularizer<sparse_parameters>
               (vw *all,bfgs *b,float regularization,sparse_parameters *weights)

{
  float fVar1;
  float *pfVar2;
  __node_base *p_Var3;
  vw_exception *this;
  ulong uVar4;
  string local_1c0;
  stringstream __msg;
  ostream local_190;
  
  if (b->regularizers == (weight *)0x0) {
    pfVar2 = calloc_or_throw<float>((ulong)(uint)(2 << ((byte)all->num_bits & 0x1f)));
    b->regularizers = pfVar2;
    if (pfVar2 == (float *)0x0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
      std::operator<<(&local_190,"Failed to allocate weight array: try decreasing -b <bits>");
      this = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (this,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/bfgs.cc"
                 ,0x21a,&local_1c0);
      __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    p_Var3 = &(weights->_map)._M_h._M_before_begin;
    while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
      uVar4 = (ulong)p_Var3[1]._M_nxt >> ((byte)weights->_stride_shift & 0x3f);
      b->regularizers[uVar4 * 2] = regularization;
      fVar1 = *(float *)((long)&(*(_Hash_node_base **)
                                  &((_Prime_rehash_policy *)(p_Var3 + 2))->_M_max_load_factor)[1].
                                _M_nxt + 4);
      if (0.0 < fVar1) {
        b->regularizers[uVar4 * 2] = 1.0 / fVar1 + b->regularizers[uVar4 * 2];
      }
    }
  }
  else {
    p_Var3 = &(weights->_map)._M_h._M_before_begin;
    while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
      fVar1 = *(float *)((long)&(*(_Hash_node_base **)
                                  &((_Prime_rehash_policy *)(p_Var3 + 2))->_M_max_load_factor)[1].
                                _M_nxt + 4);
      if (0.0 < fVar1) {
        uVar4 = (ulong)p_Var3[1]._M_nxt >> ((byte)weights->_stride_shift & 0x3f);
        b->regularizers[uVar4 * 2] = 1.0 / fVar1 + b->regularizers[uVar4 * 2];
      }
    }
  }
  p_Var3 = &(weights->_map)._M_h._M_before_begin;
  while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
    b->regularizers[((ulong)p_Var3[1]._M_nxt >> ((byte)weights->_stride_shift & 0x3f)) * 2 + 1] =
         *(weight *)
          &(*(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var3 + 2))->_M_max_load_factor)->
           _M_nxt;
  }
  return;
}

Assistant:

void preconditioner_to_regularizer(vw& all, bfgs& b, float regularization, T& weights)
{
  uint32_t length = 1 << all.num_bits;

  if (b.regularizers == nullptr)
  {
    b.regularizers = calloc_or_throw<weight>(2 * length);

    if (b.regularizers == nullptr)
      THROW("Failed to allocate weight array: try decreasing -b <bits>");

    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      uint64_t i = w.index() >> weights.stride_shift();
      b.regularizers[2 * i] = regularization;
      if ((&(*w))[W_COND] > 0.f)
        b.regularizers[2 * i] += 1.f / (&(*w))[W_COND];
    }
  }
  else
    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      if ((&(*w))[W_COND] > 0.f)
        b.regularizers[2 * (w.index() >> weights.stride_shift())] += 1.f / (&(*w))[W_COND];
    }

  for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    b.regularizers[2 * (w.index() >> weights.stride_shift()) + 1] = *w;
}